

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

TypeCode * __thiscall
TypeFactory::getTypeCode
          (TypeFactory *this,ProtoModel *model,Datatype *outtype,
          vector<Datatype_*,_std::allocator<Datatype_*>_> *intypes,bool dotdotdot)

{
  Datatype *voidtype;
  TypeCode *pTVar1;
  TypeCode tc;
  string local_98;
  TypeCode local_78;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  TypeCode::TypeCode(&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  voidtype = &getTypeVoid(this)->super_Datatype;
  TypeCode::set(&local_78,model,outtype,intypes,dotdotdot,voidtype);
  pTVar1 = (TypeCode *)findAdd(this,&local_78.super_Datatype);
  TypeCode::~TypeCode(&local_78);
  return pTVar1;
}

Assistant:

TypeCode *TypeFactory::getTypeCode(ProtoModel *model,Datatype *outtype,
				   const vector<Datatype *> &intypes,
				   bool dotdotdot)
{
  TypeCode tc("");		// getFuncdata type with no name
  tc.set(model,outtype,intypes,dotdotdot,getTypeVoid());
  return (TypeCode *) findAdd(tc);
}